

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesPowerGetLimitsExt
          (zes_pwr_handle_t hPower,uint32_t *pCount,zes_power_limit_ext_desc_t *pSustained)

{
  zes_pfnPowerGetLimitsExt_t pfnGetLimitsExt;
  dditable_t *dditable;
  ze_result_t result;
  zes_power_limit_ext_desc_t *pSustained_local;
  uint32_t *pCount_local;
  zes_pwr_handle_t hPower_local;
  
  if (*(code **)(*(long *)(hPower + 8) + 0xac8) == (code *)0x0) {
    hPower_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPower_local._4_4_ =
         (**(code **)(*(long *)(hPower + 8) + 0xac8))(*(undefined8 *)hPower,pCount,pSustained);
  }
  return hPower_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerGetLimitsExt(
        zes_pwr_handle_t hPower,                        ///< [in] Power domain handle instance.
        uint32_t* pCount,                               ///< [in,out] Pointer to the number of power limit descriptors. If count is
                                                        ///< zero, then the driver shall update the value with the total number of
                                                        ///< components of this type that are available. If count is greater than
                                                        ///< the number of components of this type that are available, then the
                                                        ///< driver shall update the value with the correct number of components.
        zes_power_limit_ext_desc_t* pSustained          ///< [in,out][optional][range(0, *pCount)] Array of query results for power
                                                        ///< limit descriptors. If count is less than the number of components of
                                                        ///< this type that are available, then the driver shall only retrieve that
                                                        ///< number of components.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_pwr_object_t*>( hPower )->dditable;
        auto pfnGetLimitsExt = dditable->zes.Power.pfnGetLimitsExt;
        if( nullptr == pfnGetLimitsExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPower = reinterpret_cast<zes_pwr_object_t*>( hPower )->handle;

        // forward to device-driver
        result = pfnGetLimitsExt( hPower, pCount, pSustained );

        return result;
    }